

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *prototype)

{
  int iVar1;
  Rep *pRVar2;
  Arena *this_00;
  TreeEnsembleParameters_TreeNode *this_01;
  
  pRVar2 = this->rep_;
  if (pRVar2 != (Rep *)0x0) {
    iVar1 = this->current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      this->current_size_ = iVar1 + 1;
      return (Type *)pRVar2->elements[iVar1];
    }
    if ((pRVar2 != (Rep *)0x0) && (pRVar2->allocated_size != this->total_size_)) goto LAB_004dd172;
  }
  Reserve(this,this->total_size_ + 1);
LAB_004dd172:
  this->rep_->allocated_size = this->rep_->allocated_size + 1;
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    this_01 = (TreeEnsembleParameters_TreeNode *)operator_new(0x70);
    CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode(this_01)
    ;
  }
  else {
    this_01 = (TreeEnsembleParameters_TreeNode *)
              Arena::AllocateAligned
                        (this_00,(type_info *)
                                 &CoreML::Specification::TreeEnsembleParameters_TreeNode::typeinfo,
                         0x70);
    CoreML::Specification::TreeEnsembleParameters_TreeNode::TreeEnsembleParameters_TreeNode(this_01)
    ;
    Arena::AddListNode(this_00,this_01,
                       arena_destruct_object<CoreML::Specification::TreeEnsembleParameters_TreeNode>
                      );
  }
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  this->rep_->elements[iVar1] = this_01;
  return this_01;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add(
    typename TypeHandler::Type* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return cast<TypeHandler>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  typename TypeHandler::Type* result =
      TypeHandler::NewFromPrototype(prototype, arena_);
  rep_->elements[current_size_++] = result;
  return result;
}